

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::
type_caster<std::tuple<int,int,std::vector<float,std::allocator<float>>const&,float,float,float,std::vector<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>,std::allocator<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>>>const&,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>const&>,void>
::load<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul>
          (type_caster<std::tuple<int,int,std::vector<float,std::allocator<float>>const&,float,float,float,std::vector<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>,std::allocator<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>>>const&,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>const&>,void>
           *this,long src,bool convert)

{
  char *pcVar1;
  long lVar2;
  bool bVar3;
  array<bool,_8UL> success;
  char local_20 [7];
  bool local_19;
  
  if ((((((*(byte *)(*(long *)(src + 8) + 0xab) & 4) != 0) &&
        (local_20[0] = type_caster<int,_void>::load
                                 ((type_caster<int,_void> *)(this + 0x5c),*(PyObject **)(src + 0x18)
                                  ,convert), (*(byte *)(*(long *)(src + 8) + 0xab) & 4) != 0)) &&
       (local_20[1] = type_caster<int,_void>::load
                                ((type_caster<int,_void> *)(this + 0x58),*(PyObject **)(src + 0x20),
                                 convert), (*(byte *)(*(long *)(src + 8) + 0xab) & 4) != 0)) &&
      ((local_20[2] = list_caster<std::vector<float,_std::allocator<float>_>,_float>::load
                                ((list_caster<std::vector<float,_std::allocator<float>_>,_float> *)
                                 (this + 0x40),*(PyObject **)(src + 0x28),convert),
       (*(byte *)(*(long *)(src + 8) + 0xab) & 4) != 0 &&
       (local_20[3] = type_caster<float,_void>::load
                                ((type_caster<float,_void> *)(this + 0x38),
                                 *(PyObject **)(src + 0x30),convert),
       (*(byte *)(*(long *)(src + 8) + 0xab) & 4) != 0)))) &&
     ((local_20[4] = type_caster<float,_void>::load
                               ((type_caster<float,_void> *)(this + 0x34),*(PyObject **)(src + 0x38)
                                ,convert), (*(byte *)(*(long *)(src + 8) + 0xab) & 4) != 0 &&
      ((local_20[5] = type_caster<float,_void>::load
                                ((type_caster<float,_void> *)(this + 0x30),
                                 *(PyObject **)(src + 0x40),convert),
       (*(byte *)(*(long *)(src + 8) + 0xab) & 4) != 0 &&
       (local_20[6] = list_caster<std::vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
                      ::load((list_caster<std::vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
                              *)(this + 0x18),*(PyObject **)(src + 0x48),convert),
       (*(byte *)(*(long *)(src + 8) + 0xab) & 4) != 0)))))) {
    local_19 = list_caster<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::load((list_caster<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)this,*(PyObject **)(src + 0x50),convert);
    if (local_20[0] == '\x01') {
      lVar2 = 1;
      do {
        bVar3 = lVar2 == 8;
        if (bVar3) {
          return bVar3;
        }
        pcVar1 = local_20 + lVar2;
        lVar2 = lVar2 + 1;
      } while (*pcVar1 != '\0');
    }
    else {
      bVar3 = false;
    }
    return bVar3;
  }
  __assert_fail("PyTuple_Check(src.ptr())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/okdshin[P]Yender/pybind11/include/pybind11/cast.h"
                ,0x300,
                "bool pybind11::detail::type_caster<std::tuple<int, int, const std::vector<float> &, float, float, float, const std::vector<std::vector<std::vector<float>>> &, const std::vector<std::vector<unsigned char>> &>>::load(handle, bool, index_sequence<Indices...>) [type = std::tuple<int, int, const std::vector<float> &, float, float, float, const std::vector<std::vector<std::vector<float>>> &, const std::vector<std::vector<unsigned char>> &>, SFINAE = void, Indices = <0UL, 1UL, 2UL, 3UL, 4UL, 5UL, 6UL, 7UL>]"
               );
}

Assistant:

bool load(handle src, bool convert, index_sequence<Indices...>) {
        std::array<bool, size> success {{
            std::get<Indices>(value).load(PyTuple_GET_ITEM(src.ptr(), Indices), convert)...
        }};
        (void) convert; /* avoid a warning when the tuple is empty */
        for (bool r : success)
            if (!r)
                return false;
        return true;
    }